

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

bool __thiscall semver::valid(semver *this,string_view str)

{
  string_view str_00;
  from_chars_result fVar1;
  undefined1 local_78 [48];
  _Alloc_hider local_48;
  size_type sStack_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  pointer local_28;
  pointer ppStack_20;
  pointer local_18;
  
  str_00._M_len = str._M_len;
  local_48._M_p = (pointer)&local_38;
  local_78._8_8_ = 0;
  local_78._24_8_ = 0;
  local_78._40_8_ = 0;
  sStack_40 = 0;
  local_38._8_8_ = 0;
  local_78._16_8_ = local_78 + 0x20;
  local_78._0_4_ = 0;
  local_78._4_4_ = 1;
  local_78._32_8_ = 0;
  local_38._M_allocated_capacity = 0;
  local_28 = (pointer)0x0;
  ppStack_20 = (pointer)0x0;
  local_18 = (pointer)0x0;
  str_00._M_str = local_78;
  fVar1 = detail::parse<int,int,int>
                    ((detail *)this,str_00,(version<int,_int,_int> *)local_78._16_8_);
  version<int,_int,_int>::~version((version<int,_int,_int> *)local_78);
  return fVar1.super_from_chars_result.ec == 0;
}

Assistant:

SEMVER_CONSTEXPR ~version() = default;